

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> * __thiscall
kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::operator=
          (ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *this,
          ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *other)

{
  ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *other_local;
  ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Reader *)0x0;
  other->pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
  other->endPtr = (Reader *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }